

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O3

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals
          (FastAndEffectiveFeaturePreservingMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ParameterSet *pPVar8;
  pointer pVVar9;
  mesh_ptr pPVar10;
  bool bVar11;
  size_type __new_size;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  FaceIter FVar21;
  undefined1 local_c0 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  double threshold_T;
  undefined1 auStack_88 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  undefined1 auStack_68 [4];
  int face_neighbor_index;
  FaceIter f_it;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  int local_34 [2];
  int normal_iteration_number;
  
  pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  f_it._8_8_ = ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&f_it.hnd_,"Face Neighbor","");
  bVar11 = ParameterSet::getValue
                     (pPVar8,(string *)&f_it.hnd_,
                      (int *)((long)&previous_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if ((pointer *)f_it._8_8_ != ppvVar1) {
    operator_delete((void *)f_it._8_8_);
  }
  if (bVar11) {
    pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
    f_it._8_8_ = ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&f_it.hnd_,"Threshold T","");
    bVar11 = ParameterSet::getValue
                       (pPVar8,(string *)&f_it.hnd_,
                        (double *)
                        &face_neighbor.
                         super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((pointer *)f_it._8_8_ != ppvVar1) {
      operator_delete((void *)f_it._8_8_);
    }
    if (bVar11) {
      pPVar8 = (this->super_MeshDenoisingBase).parameter_set_;
      f_it._8_8_ = ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&f_it.hnd_,"Normal Iteration Num.","");
      bVar11 = ParameterSet::getValue(pPVar8,(string *)&f_it.hnd_,local_34);
      if ((pointer *)f_it._8_8_ != ppvVar1) {
        operator_delete((void *)f_it._8_8_);
      }
      if (bVar11) {
        f_it.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
        f_it.skip_bits_ = 0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getAllFaceNeighbor
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    *)&f_it.hnd_,
                   (uint)(previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0),true);
        __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                            super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                            .
                                            super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                 + 0x28))(mesh);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        resize(filtered_normals,__new_size);
        auStack_88 = (undefined1  [8])0x0;
        previous_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        previous_normals.
        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        MeshDenoisingBase::getFaceNormal
                  (&this->super_MeshDenoisingBase,mesh,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)auStack_88);
        if (0 < local_34[0]) {
          iVar15 = 0;
          do {
            _auStack_68 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
            while( true ) {
              FVar21 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
              if (f_it.mesh_._0_4_ == (BaseHandle)FVar21.hnd_.super_BaseHandle.idx_ &&
                  _auStack_68 == FVar21.mesh_) break;
              lVar12 = (long)(int)f_it.mesh_._0_4_;
              dVar19 = (((pointer)((long)auStack_88 + lVar12 * 0x18))->super_VectorDataT<double,_3>)
                       .values_[0];
              dVar2 = (((pointer)((long)auStack_88 + lVar12 * 0x18))->super_VectorDataT<double,_3>).
                      values_[1];
              dVar3 = (((pointer)((long)auStack_88 + lVar12 * 0x18))->super_VectorDataT<double,_3>).
                      values_[2];
              std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_c0,(vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)(lVar12 * 0x18 + f_it._8_8_));
              uVar13 = (uint)((ulong)((long)face_neighbor.
                                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                     (long)local_c0) >> 2);
              if ((int)uVar13 < 1) {
                dVar17 = 0.0;
                dVar18 = 0.0;
                dVar16 = 0.0;
              }
              else {
                dVar16 = 0.0;
                uVar14 = 0;
                dVar18 = 0.0;
                dVar17 = 0.0;
                do {
                  iVar7 = (((pointer)((long)local_c0 + uVar14 * 4))->super_BaseHandle).idx_;
                  dVar4 = (((pointer)((long)auStack_88 + (long)iVar7 * 0x18))->
                          super_VectorDataT<double,_3>).values_[0];
                  dVar5 = (((pointer)((long)auStack_88 + (long)iVar7 * 0x18))->
                          super_VectorDataT<double,_3>).values_[1];
                  dVar6 = (((pointer)((long)auStack_88 + (long)iVar7 * 0x18))->
                          super_VectorDataT<double,_3>).values_[2];
                  dVar20 = (dVar3 * dVar6 + dVar2 * dVar5 + dVar19 * dVar4 + 0.0) -
                           (double)face_neighbor.
                                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  dVar20 = (double)((ulong)(dVar20 * dVar20) & -(ulong)(0.0 < dVar20));
                  dVar17 = dVar17 + dVar4 * dVar20;
                  dVar18 = dVar18 + dVar5 * dVar20;
                  dVar16 = dVar16 + dVar20 * dVar6;
                  uVar14 = uVar14 + 1;
                } while ((uVar13 & 0x7fffffff) != uVar14);
              }
              dVar19 = SQRT(dVar16 * dVar16 + dVar17 * dVar17 + dVar18 * dVar18);
              lVar12 = (long)(int)f_it.mesh_._0_4_;
              pVVar9 = (filtered_normals->
                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar9[lVar12].super_VectorDataT<double,_3>.values_[0] = dVar17 / dVar19;
              pVVar9[lVar12].super_VectorDataT<double,_3>.values_[1] = dVar18 / dVar19;
              pVVar9[lVar12].super_VectorDataT<double,_3>.values_[2] = dVar16 / dVar19;
              if (local_c0 != (undefined1  [8])0x0) {
                operator_delete((void *)local_c0);
              }
              pPVar10 = f_it.mesh_;
              f_it.mesh_._0_4_ =
                   (BaseHandle)(BaseHandle)((int)auStack_68._8_4_.super_BaseHandle + 1);
              if ((ulong)pPVar10 >> 0x20 != 0) {
                OpenMesh::Iterators::
                GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)auStack_68);
              }
            }
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)auStack_88,filtered_normals);
            iVar15 = iVar15 + 1;
          } while (iVar15 < local_34[0]);
        }
        if (auStack_88 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_88);
        }
        std::
        vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                   *)&f_it.hnd_);
      }
    }
  }
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double threshold_T;
    if(!parameter_set_->getValue(string("Threshold T"), threshold_T))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, true);

    filtered_normals.resize(mesh.n_faces());

    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            TriMesh::Normal ni = previous_normals[f_it->idx()];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[f_it->idx()];
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            for(int i = 0; i <(int)face_neighbor.size(); i++)
            {
                TriMesh::Normal nj = previous_normals[face_neighbor[i].idx()];
                double value = (ni | nj) - threshold_T;
                double weight = (value > 0) ? value * value : 0;
                temp_normal += nj * weight;
            }
            temp_normal.normalize();
            filtered_normals[f_it->idx()] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}